

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_csv_dataset.cpp
# Opt level: O3

int main(void)

{
  int *__src;
  long lVar1;
  undefined8 uVar2;
  unsigned_long uVar3;
  uint uVar4;
  result_type_conflict rVar5;
  unsigned_long __res;
  char *pcVar6;
  ostream *poVar7;
  undefined1 *puVar8;
  size_t __i;
  long lVar9;
  int iVar10;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> integers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_streams;
  string pathToErase;
  string pathToInsert;
  string pathToFind;
  uniform_int_distribution<int> dist;
  ofstream outputStreamForFind;
  ofstream outputStreamForInsert;
  ofstream outputStreamForErase;
  size_type __dnew;
  char local_1a71;
  vector<int,_std::allocator<int>_> local_1a70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a00;
  ios_base *local_19e0;
  ios_base *local_19d8;
  ios_base *local_19d0;
  undefined8 local_19c8;
  param_type local_19c0;
  long local_19b8;
  filebuf local_19b0 [24];
  byte abStack_1998 [216];
  ios_base aiStack_18c0 [264];
  long local_17b8;
  filebuf local_17b0 [24];
  byte abStack_1798 [216];
  ios_base aiStack_16c0 [264];
  long local_15b8;
  filebuf local_15b0 [24];
  byte abStack_1598 [216];
  ios_base local_14c0 [264];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_1a00._M_dataplus._M_p = (pointer)&local_1a00.field_2;
  local_13b8._M_x[0] = 0x89;
  pcVar6 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1a00,(ulong)&local_13b8);
  uVar3 = local_13b8._M_x[0];
  local_1a00.field_2._M_allocated_capacity = local_13b8._M_x[0];
  local_1a00._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004/dataset/data/find"
         ,0x89);
  local_1a00._M_string_length = uVar3;
  pcVar6[uVar3] = '\0';
  local_1a40._M_dataplus._M_p = (pointer)&local_1a40.field_2;
  local_13b8._M_x[0] = 0x8a;
  pcVar6 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1a40,(ulong)&local_13b8);
  uVar3 = local_13b8._M_x[0];
  local_1a40.field_2._M_allocated_capacity = local_13b8._M_x[0];
  local_1a40._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004/dataset/data/erase"
         ,0x8a);
  local_1a40._M_string_length = uVar3;
  pcVar6[uVar3] = '\0';
  local_1a20._M_dataplus._M_p = (pointer)&local_1a20.field_2;
  local_13b8._M_x[0] = 0x8b;
  pcVar6 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1a20,(ulong)&local_13b8);
  uVar3 = local_13b8._M_x[0];
  local_1a20.field_2._M_allocated_capacity = local_13b8._M_x[0];
  local_1a20._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004/dataset/data/insert"
         ,0x8b);
  local_1a20._M_string_length = uVar3;
  pcVar6[uVar3] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dataset pathToInsert: ",0x16);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1a20._M_dataplus._M_p,local_1a20._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dataset pathToFind: ",0x14);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1a00._M_dataplus._M_p,local_1a00._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dataset pathToErase: ",0x15);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1a40._M_dataplus._M_p,local_1a40._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_1a58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [9])"/100.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [9])"/500.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [10])"/1000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [10])"/5000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [11])"/10000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [11])"/50000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [12])"/100000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [12])"/500000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [13])"/1000000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a58,
             (char (*) [13])"/5000000.csv");
  local_13b8._M_x[2] = 0xc35000002710;
  local_13b8._M_x[3] = 0x7a120000186a0;
  local_13b8._M_x[0] = 0x1f400000064;
  local_13b8._M_x[1] = 0x1388000003e8;
  local_13b8._M_x[4] = 0x4c4b40000f4240;
  __l._M_len = 10;
  __l._M_array = (iterator)&local_13b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_1a70,__l,(allocator_type *)&local_19b8);
  lVar1 = _VTT;
  if (local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_19c8 = __filebuf;
    local_19d8 = aiStack_16c0;
    local_19e0 = local_14c0;
    local_19d0 = aiStack_18c0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_13b8,&local_1a00,
                     local_1a58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      std::ofstream::ofstream(&local_19b8,(string *)&local_13b8,_S_trunc);
      if ((unsigned_long *)local_13b8._M_x[0] != local_13b8._M_x + 2) {
        operator_delete((void *)local_13b8._M_x[0],local_13b8._M_x[2] + 1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_13b8,&local_1a40,
                     local_1a58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      std::ofstream::ofstream((ostream *)&local_15b8,(string *)&local_13b8,_S_trunc);
      if ((unsigned_long *)local_13b8._M_x[0] != local_13b8._M_x + 2) {
        operator_delete((void *)local_13b8._M_x[0],local_13b8._M_x[2] + 1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_13b8,&local_1a20,
                     local_1a58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      std::ofstream::ofstream(&local_17b8,(string *)&local_13b8,_S_trunc);
      if ((unsigned_long *)local_13b8._M_x[0] != local_13b8._M_x + 2) {
        operator_delete((void *)local_13b8._M_x[0],local_13b8._M_x[2] + 1);
      }
      uVar4 = std::chrono::_V2::system_clock::now();
      puVar8 = (undefined1 *)(ulong)uVar4;
      local_13b8._M_x[0] = (unsigned_long)puVar8;
      lVar9 = 1;
      do {
        puVar8 = (undefined1 *)
                 (ulong)(((uint)((ulong)puVar8 >> 0x1e) ^ (uint)puVar8) * 0x6c078965 + (int)lVar9);
        local_13b8._M_x[lVar9] = (unsigned_long)puVar8;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x270);
      local_13b8._M_p = 0x270;
      local_19c0._M_a = 0;
      local_19c0._M_b = 10000000;
      if ((abStack_1998[*(long *)(local_19b8 + -0x18)] & 5) == 0) {
        if (1 < *local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
          iVar10 = 0;
          do {
            rVar5 = std::uniform_int_distribution<int>::operator()
                              ((uniform_int_distribution<int> *)&local_19c0,&local_13b8,&local_19c0)
            ;
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_19b8,rVar5);
            local_1a71 = ',';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1a71,1);
            iVar10 = iVar10 + 1;
          } while (iVar10 < *local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + -1);
        }
        rVar5 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_19c0,&local_13b8,&local_19c0);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_19b8,rVar5);
        local_1a71 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1a71,1);
      }
      if ((abStack_1598[*(long *)(local_15b8 + -0x18)] & 5) == 0) {
        if (1 < *local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
          iVar10 = 0;
          do {
            rVar5 = std::uniform_int_distribution<int>::operator()
                              ((uniform_int_distribution<int> *)&local_19c0,&local_13b8,&local_19c0)
            ;
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_15b8,rVar5);
            local_1a71 = ',';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1a71,1);
            iVar10 = iVar10 + 1;
          } while (iVar10 < *local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + -1);
        }
        rVar5 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_19c0,&local_13b8,&local_19c0);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_15b8,rVar5);
        local_1a71 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1a71,1);
      }
      if ((abStack_1798[*(long *)(local_17b8 + -0x18)] & 5) == 0) {
        if (1 < *local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
          iVar10 = 0;
          do {
            rVar5 = std::uniform_int_distribution<int>::operator()
                              ((uniform_int_distribution<int> *)&local_19c0,&local_13b8,&local_19c0)
            ;
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_17b8,rVar5);
            local_1a71 = ',';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1a71,1);
            iVar10 = iVar10 + 1;
          } while (iVar10 < *local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + -1);
        }
        rVar5 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_19c0,&local_13b8,&local_19c0);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_17b8,rVar5);
        local_1a71 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1a71,1);
      }
      __src = local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
      if (__src != local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
        memmove(local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,__src,
                (long)local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src);
      }
      local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_1a58,
                 (iterator)
                 local_1a58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = local_19c8;
      local_17b8 = lVar1;
      *(undefined8 *)(local_17b0 + *(long *)(lVar1 + -0x18) + -8) = local_19c8;
      std::filebuf::~filebuf(local_17b0);
      std::ios_base::~ios_base(local_19d8);
      local_15b8 = lVar1;
      *(undefined8 *)(local_15b0 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
      std::filebuf::~filebuf(local_15b0);
      std::ios_base::~ios_base(local_19e0);
      local_19b8 = lVar1;
      *(undefined8 *)(local_19b0 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
      std::filebuf::~filebuf(local_19b0);
      std::ios_base::~ios_base(local_19d0);
    } while (local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a20._M_dataplus._M_p != &local_1a20.field_2) {
    operator_delete(local_1a20._M_dataplus._M_p,local_1a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a40._M_dataplus._M_p != &local_1a40.field_2) {
    operator_delete(local_1a40._M_dataplus._M_p,local_1a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a00._M_dataplus._M_p != &local_1a00.field_2) {
    operator_delete(local_1a00._M_dataplus._M_p,local_1a00.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {
  const auto pathToFind = string(kDatasetPathFind);
  const auto pathToErase = string(kDatasetPathErase);
  const auto pathToInsert = string(kDatasetPathInsert);
  cout << "Dataset pathToInsert: " << pathToInsert << endl;
  cout << "Dataset pathToFind: " << pathToFind << endl;
  cout << "Dataset pathToErase: " << pathToErase << endl;

  vector<string> output_streams;
  output_streams.emplace_back("/100.csv");
  output_streams.emplace_back("/500.csv");
  output_streams.emplace_back("/1000.csv");
  output_streams.emplace_back("/5000.csv");
  output_streams.emplace_back("/10000.csv");
  output_streams.emplace_back("/50000.csv");
  output_streams.emplace_back("/100000.csv");
  output_streams.emplace_back("/500000.csv");
  output_streams.emplace_back("/1000000.csv");
  output_streams.emplace_back("/5000000.csv");

  vector<int> integers = {100, 500, 1000, 5000, 10000, 50000, 100000, 500000, 1000000, 5000000};

  while (!integers.empty()) {
    auto outputStreamForFind = ofstream(pathToFind + output_streams.front(), ios::ios_base::trunc);
    auto outputStreamForErase = ofstream(pathToErase + output_streams.front(), ios::ios_base::trunc);
    auto outputStreamForInsert = ofstream(pathToInsert + output_streams.front(), ios::ios_base::trunc);

    const auto seed = chrono::system_clock::now().time_since_epoch().count();
    auto engine = mt19937(seed);  // без seed`а генератор будет выдавать одни и те же значения
    auto dist = uniform_int_distribution(0, 10000000);  // равновероятное распределение генерируемых чисел

    if (outputStreamForFind) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForFind << dist(engine) << ',';
      }
      outputStreamForFind << dist(engine) << '\n';
    }

    if (outputStreamForErase) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForErase << dist(engine) << ',';
      }
      outputStreamForErase << dist(engine) << '\n';
    }

    if (outputStreamForInsert) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForInsert << dist(engine) << ',';
      }
      outputStreamForInsert << dist(engine) << '\n';
    }

    integers.erase(integers.begin());
    output_streams.erase(output_streams.begin());
  }

  return 0;
}